

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

bool __thiscall
ON_Mesh::IsValidNewNgonInformation
          (ON_Mesh *this,uint Vcount,uint *ngon_vi,uint Fcount,uint *ngon_fi)

{
  long lVar1;
  uint *puVar2;
  ulong uVar3;
  
  if (2 < Vcount) {
    uVar3 = 0;
    do {
      if ((uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count <= ngon_vi[uVar3]) {
        return false;
      }
      uVar3 = uVar3 + 1;
    } while (Vcount != uVar3);
    puVar2 = (uint *)0x0;
    if ((Fcount != 0) && ((this->m_Ngon).m_count != 0)) {
      if ((this->m_F).m_count == (this->m_NgonMap).m_count) {
        puVar2 = (this->m_NgonMap).m_a;
      }
      else {
        puVar2 = (uint *)0x0;
      }
    }
    if (Fcount == 0) {
      return Fcount == 0;
    }
    lVar1 = 0;
    while ((ngon_fi[lVar1] < (uint)(this->m_F).m_count &&
           ((puVar2 == (uint *)0x0 || (puVar2[ngon_fi[lVar1]] == 0xffffffff))))) {
      lVar1 = lVar1 + 1;
      if (Fcount == (uint)lVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Mesh::IsValidNewNgonInformation(
  unsigned int Vcount, 
  const unsigned int* ngon_vi,
  unsigned int Fcount, 
  const unsigned int* ngon_fi
  ) const
{
  unsigned int i;
  const unsigned int meshVcount = m_V.UnsignedCount();
  const unsigned int meshFcount = m_F.UnsignedCount();
  if ( Vcount < 3 )
    return false;

  for ( i = 0; i < Vcount; i++ )
  {
    if ( ngon_vi[i] >= meshVcount )
      return false;
  }

  const unsigned int* ngon_map = (Fcount > 0) ? NgonMap() : 0;

  for ( i = 0; i < Fcount; i++ )
  {
    if ( ngon_fi[i] >= meshFcount )
      return false;
    if ( ngon_map && ON_UNSET_UINT_INDEX != ngon_map[ngon_fi[i]] )
      return false;
  }

  return true;
}